

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGNode.h
# Opt level: O2

void __thiscall dg::sdg::DGNodeArtificial::~DGNodeArtificial(DGNodeArtificial *this)

{
  DepDGElement::~DepDGElement((DepDGElement *)this);
  operator_delete(this,0x140);
  return;
}

Assistant:

DGNodeArtificial(DependenceGraph &g)
            : DGNode(g, DGElementType::ND_ARTIFICIAL) {}